

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpControl.cpp
# Opt level: O3

void * gpControlThread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  SOCKET SVar9;
  char *pcVar10;
  CHRONO chrono_period;
  GPCONTROL gpcontrol;
  char szTemp [256];
  char szSaveFilePath [256];
  int local_ce4;
  timespec local_ce0;
  int local_ccc;
  timespec local_cc8;
  long local_cb8;
  long lStack_cb0;
  long local_ca8;
  long lStack_ca0;
  timespec local_c98;
  int local_c88;
  GPCONTROL local_c80;
  char local_238 [256];
  char local_138 [264];
  
  memset(&local_c80,0,0xa48);
  iVar5 = clock_getres(4,&local_c98);
  if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_cc8), iVar5 == 0)) {
    local_c88 = 0;
    local_cb8 = 0;
    lStack_cb0 = 0;
    local_ca8 = 0;
    lStack_ca0 = 0;
  }
  local_ce4 = 100;
  bVar2 = false;
  local_ccc = 0;
  do {
    bVar2 = !bVar2;
    while( true ) {
      if (local_c88 == 0) {
        clock_gettime(4,&local_ce0);
        local_cb8 = local_ce0.tv_sec;
        lStack_cb0 = local_ce0.tv_nsec;
        local_ce0.tv_sec =
             ((local_ce0.tv_sec + local_ca8) - local_cc8.tv_sec) +
             (local_ce0.tv_nsec + lStack_ca0) / 1000000000;
        local_ce0.tv_nsec = (local_ce0.tv_nsec + lStack_ca0) % 1000000000 - local_cc8.tv_nsec;
        if (local_ce0.tv_nsec < 0) {
          local_ce0.tv_sec = local_ce0.tv_sec + ~((ulong)-local_ce0.tv_nsec / 1000000000);
          local_ce0.tv_nsec =
               local_ce0.tv_nsec + 1000000000 +
               ((ulong)-local_ce0.tv_nsec / 1000000000) * 1000000000;
        }
        local_ca8 = local_ce0.tv_sec;
        lStack_ca0 = local_ce0.tv_nsec;
      }
      iVar5 = clock_getres(4,&local_c98);
      if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_cc8), iVar5 == 0)) {
        local_c88 = 0;
        local_ca8 = 0;
        lStack_ca0 = 0;
        local_cb8 = 0;
        lStack_cb0 = 0;
      }
      local_ce0.tv_sec = (long)(local_ce4 / 1000);
      local_ce0.tv_nsec = (long)((local_ce4 % 1000) * 1000000);
      nanosleep(&local_ce0,(timespec *)0x0);
      if (bPausegpControl == 0) break;
      if (!bVar2) {
        puts("gpControl Paused.");
        SVar9 = local_c80.tcpsock;
        if (local_c80.bDisableHTTPPersistent == 0) {
          shutdown(local_c80.tcpsock,2);
          iVar5 = close(SVar9);
          if (iVar5 == 0) goto LAB_0016565e;
          puts("Error while disconnecting a gpControl.");
          SVar9 = local_c80.RS232Port.s;
          switch(local_c80.RS232Port.DevType) {
          case 0:
            iVar5 = (int)local_c80.RS232Port.hDev;
            goto LAB_0016575d;
          case 1:
          case 3:
            iVar5 = local_c80.RS232Port.s;
            break;
          case 2:
            shutdown(local_c80.RS232Port.s,2);
            close(SVar9);
          case 4:
            iVar5 = local_c80.RS232Port.s_srv;
            break;
          default:
            goto switchD_001656d2_default;
          }
          shutdown(iVar5,2);
LAB_0016575d:
          close(iVar5);
          goto switchD_001656d2_default;
        }
LAB_0016565e:
        SVar9 = local_c80.RS232Port.s;
        switch(local_c80.RS232Port.DevType) {
        case 0:
          iVar5 = (int)local_c80.RS232Port.hDev;
          goto LAB_00165707;
        case 1:
        case 3:
          iVar5 = local_c80.RS232Port.s;
          break;
        case 2:
          shutdown(local_c80.RS232Port.s,2);
          close(SVar9);
        case 4:
          iVar5 = local_c80.RS232Port.s_srv;
          break;
        default:
          goto switchD_0016567d_default;
        }
        shutdown(iVar5,2);
LAB_00165707:
        iVar5 = close(iVar5);
        if (iVar5 == 0) {
          pcVar10 = "gpControl disconnected.";
        }
        else {
switchD_0016567d_default:
          pcVar10 = "gpControl disconnection failed.";
        }
        puts(pcVar10);
      }
switchD_001656d2_default:
      if (bExit != 0) {
        bVar3 = true;
        goto LAB_00165c3c;
      }
      local_ce0.tv_sec = 0;
      local_ce0.tv_nsec = 100000000;
      nanosleep(&local_ce0,(timespec *)0x0);
      bVar2 = true;
    }
    if (bRestartgpControl == 0) {
      if (bVar2) goto LAB_00165a1e;
      iVar5 = KeepAlivegpControl(&local_c80);
      if (iVar5 == 0) goto LAB_00165ae1;
      puts("Connection to a gpControl lost.");
      SVar9 = local_c80.tcpsock;
      if (local_c80.bDisableHTTPPersistent == 0) {
        shutdown(local_c80.tcpsock,2);
        iVar5 = close(SVar9);
        if (iVar5 == 0) goto LAB_00165840;
        puts("Error while disconnecting a gpControl.");
        SVar9 = local_c80.RS232Port.s;
        switch(local_c80.RS232Port.DevType) {
        case 0:
          SVar9 = (int)local_c80.RS232Port.hDev;
          goto LAB_00165c22;
        case 1:
        case 3:
          break;
        case 2:
          shutdown(local_c80.RS232Port.s,2);
          close(SVar9);
        case 4:
          SVar9 = local_c80.RS232Port.s_srv;
          break;
        default:
          goto switchD_00165922_default;
        }
        shutdown(SVar9,2);
LAB_00165c22:
        close(SVar9);
      }
      else {
LAB_00165840:
        SVar9 = local_c80.RS232Port.s;
        switch(local_c80.RS232Port.DevType) {
        case 0:
          iVar5 = (int)local_c80.RS232Port.hDev;
          goto LAB_001659b3;
        case 1:
        case 3:
          iVar5 = local_c80.RS232Port.s;
          break;
        case 2:
          shutdown(local_c80.RS232Port.s,2);
          close(SVar9);
        case 4:
          iVar5 = local_c80.RS232Port.s_srv;
          break;
        default:
          goto switchD_0016585f_default;
        }
        shutdown(iVar5,2);
LAB_001659b3:
        iVar5 = close(iVar5);
        if (iVar5 == 0) {
          pcVar10 = "gpControl disconnected.";
        }
        else {
switchD_0016585f_default:
          pcVar10 = "gpControl disconnection failed.";
        }
        puts(pcVar10);
      }
switchD_00165922_default:
      local_ccc = local_ccc + 1;
      if (ExitOnErrorCount <= local_ccc && 0 < ExitOnErrorCount) {
        bExit = 1;
        bVar3 = true;
        break;
      }
      bVar2 = false;
      bVar3 = true;
    }
    else {
      if (!bVar2) {
        puts("Restarting a gpControl.");
        SVar9 = local_c80.tcpsock;
        if (local_c80.bDisableHTTPPersistent == 0) {
          shutdown(local_c80.tcpsock,2);
          iVar5 = close(SVar9);
          if (iVar5 == 0) goto LAB_001657d4;
          puts("Error while disconnecting a gpControl.");
          SVar9 = local_c80.RS232Port.s;
          switch(local_c80.RS232Port.DevType) {
          case 0:
            iVar5 = (int)local_c80.RS232Port.hDev;
            goto LAB_00165a09;
          case 1:
          case 3:
            iVar5 = local_c80.RS232Port.s;
            break;
          case 2:
            shutdown(local_c80.RS232Port.s,2);
            close(SVar9);
          case 4:
            iVar5 = local_c80.RS232Port.s_srv;
            break;
          default:
            goto switchD_001658bb_default;
          }
          shutdown(iVar5,2);
LAB_00165a09:
          close(iVar5);
          goto switchD_001658bb_default;
        }
LAB_001657d4:
        SVar9 = local_c80.RS232Port.s;
        switch(local_c80.RS232Port.DevType) {
        case 0:
          iVar5 = (int)local_c80.RS232Port.hDev;
          goto LAB_0016595a;
        case 1:
        case 3:
          iVar5 = local_c80.RS232Port.s;
          break;
        case 2:
          shutdown(local_c80.RS232Port.s,2);
          close(SVar9);
        case 4:
          iVar5 = local_c80.RS232Port.s_srv;
          break;
        default:
          goto switchD_001657f3_default;
        }
        shutdown(iVar5,2);
LAB_0016595a:
        iVar5 = close(iVar5);
        if (iVar5 == 0) {
          pcVar10 = "gpControl disconnected.";
        }
        else {
switchD_001657f3_default:
          pcVar10 = "gpControl disconnection failed.";
        }
        puts(pcVar10);
      }
switchD_001658bb_default:
      bRestartgpControl = 0;
LAB_00165a1e:
      iVar6 = ConnectgpControl(&local_c80,"gpControl0.txt");
      iVar5 = local_c80.threadperiod;
      if (iVar6 != 0) {
        local_ce0.tv_sec = 1;
        local_ce0.tv_nsec = 0;
        nanosleep(&local_ce0,(timespec *)0x0);
        goto switchD_00165922_default;
      }
      local_ce4 = local_c80.threadperiod;
      if ((FILE *)local_c80.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_c80.pfSaveFile);
        local_c80.pfSaveFile = (FILE *)0x0;
      }
      bVar2 = true;
      if (local_c80.bSaveRawData == 0) {
LAB_00165ae1:
        bVar2 = true;
        bVar3 = false;
      }
      else {
        if (local_c80.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_238,"gpcontrol",10);
        }
        else {
          sprintf(local_238,"%.127s",local_c80.szCfgFilePath);
        }
        sVar7 = strlen(local_238);
        iVar6 = (int)sVar7 + 1;
        uVar8 = sVar7 & 0xffffffff;
        do {
          if ((int)uVar8 < 1) goto LAB_00165b4f;
          uVar1 = uVar8 - 1;
          iVar6 = iVar6 + -1;
          lVar4 = uVar8 - 1;
          uVar8 = uVar1;
        } while (local_238[lVar4] != '.');
        if ((uVar1 != 0) && (iVar6 <= (int)sVar7)) {
          memset(local_238 + (uVar1 & 0xffffffff),0,sVar7 - (uVar1 & 0xffffffff));
        }
LAB_00165b4f:
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar10 = strtimeex_fns();
        sprintf(local_138,"log/%.127s_%.64s.csv",local_238,pcVar10);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        local_c80.pfSaveFile = (FILE *)fopen(local_138,"w");
        if ((FILE *)local_c80.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create gpControl data file.");
          bVar3 = false;
          break;
        }
        fwrite("tv_sec;tv_usec;val;\n",0x14,1,(FILE *)local_c80.pfSaveFile);
        fflush((FILE *)local_c80.pfSaveFile);
        bVar3 = false;
        local_ce4 = iVar5;
      }
    }
  } while (bExit == 0);
LAB_00165c3c:
  if (local_c88 == 0) {
    clock_gettime(4,&local_ce0);
    local_cb8 = local_ce0.tv_sec;
    lStack_cb0 = local_ce0.tv_nsec;
    local_ce0.tv_sec =
         ((local_ce0.tv_sec + local_ca8) - local_cc8.tv_sec) +
         (local_ce0.tv_nsec + lStack_ca0) / 1000000000;
    local_ce0.tv_nsec = (local_ce0.tv_nsec + lStack_ca0) % 1000000000 - local_cc8.tv_nsec;
    if (local_ce0.tv_nsec < 0) {
      local_ce0.tv_sec = local_ce0.tv_sec + ~((ulong)-local_ce0.tv_nsec / 1000000000);
      local_ce0.tv_nsec =
           local_ce0.tv_nsec + 1000000000 + ((ulong)-local_ce0.tv_nsec / 1000000000) * 1000000000;
    }
    local_ca8 = local_ce0.tv_sec;
    lStack_ca0 = local_ce0.tv_nsec;
  }
  if ((FILE *)local_c80.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)local_c80.pfSaveFile);
    local_c80.pfSaveFile = (FILE *)0x0;
  }
  if (bVar3) goto switchD_00165da1_default;
  if (local_c80.bDisableHTTPPersistent == 0) {
    shutdown(local_c80.tcpsock,2);
    iVar5 = close(local_c80.tcpsock);
    if (iVar5 == 0) goto LAB_00165d31;
    puts("Error while disconnecting a gpControl.");
    switch(local_c80.RS232Port.DevType) {
    case 0:
      goto LAB_00165e1f;
    case 1:
    case 3:
      SVar9 = local_c80.RS232Port.s;
      break;
    case 2:
      shutdown(local_c80.RS232Port.s,2);
      close(local_c80.RS232Port.s);
    case 4:
      SVar9 = local_c80.RS232Port.s_srv;
      break;
    default:
      goto switchD_00165da1_default;
    }
    shutdown(SVar9,2);
    local_c80.RS232Port.hDev._0_4_ = SVar9;
LAB_00165e1f:
    close((int)local_c80.RS232Port.hDev);
    goto switchD_00165da1_default;
  }
LAB_00165d31:
  switch(local_c80.RS232Port.DevType) {
  case 0:
    goto LAB_00165dd0;
  case 1:
  case 3:
    SVar9 = local_c80.RS232Port.s;
    break;
  case 2:
    shutdown(local_c80.RS232Port.s,2);
    close(local_c80.RS232Port.s);
  case 4:
    SVar9 = local_c80.RS232Port.s_srv;
    break;
  default:
    goto switchD_00165d50_default;
  }
  shutdown(SVar9,2);
  local_c80.RS232Port.hDev._0_4_ = SVar9;
LAB_00165dd0:
  iVar5 = close((int)local_c80.RS232Port.hDev);
  if (iVar5 == 0) {
    pcVar10 = "gpControl disconnected.";
  }
  else {
switchD_00165d50_default:
    pcVar10 = "gpControl disconnection failed.";
  }
  puts(pcVar10);
switchD_00165da1_default:
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE gpControlThread(void* pParam)
{
	GPCONTROL gpcontrol;
	//struct timeval tv;
	//double val = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&gpcontrol, 0, sizeof(GPCONTROL));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPausegpControl)
		{
			if (bConnected)
			{
				printf("gpControl Paused.\n");
				bConnected = FALSE;
				DisconnectgpControl(&gpcontrol);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartgpControl)
		{
			if (bConnected)
			{
				printf("Restarting a gpControl.\n");
				bConnected = FALSE;
				DisconnectgpControl(&gpcontrol);
			}
			bRestartgpControl = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectgpControl(&gpcontrol, "gpControl0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = gpcontrol.threadperiod;

				if (gpcontrol.pfSaveFile != NULL)
				{
					fclose(gpcontrol.pfSaveFile); 
					gpcontrol.pfSaveFile = NULL;
				}
				if ((gpcontrol.bSaveRawData)&&(gpcontrol.pfSaveFile == NULL)) 
				{
					if (strlen(gpcontrol.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", gpcontrol.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "gpcontrol");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					gpcontrol.pfSaveFile = fopen(szSaveFilePath, "w");
					if (gpcontrol.pfSaveFile == NULL) 
					{
						printf("Unable to create gpControl data file.\n");
						break;
					}
					fprintf(gpcontrol.pfSaveFile, "tv_sec;tv_usec;val;\n"); 
					fflush(gpcontrol.pfSaveFile);
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (KeepAlivegpControl(&gpcontrol) == EXIT_SUCCESS)
			{
				//if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				//EnterCriticalSection(&StateVariablesCS);


				//LeaveCriticalSection(&StateVariablesCS);

				//if (gpcontrol.bSaveRawData)
				//{
				//	fprintf(gpcontrol.pfSaveFile, "%d;%d;%f;\n", (int)tv.tv_sec, (int)tv.tv_usec, val);
				//	fflush(gpcontrol.pfSaveFile);
				//}
			}
			else
			{
				printf("Connection to a gpControl lost.\n");
				bConnected = FALSE;
				DisconnectgpControl(&gpcontrol);
			}		
		}

		//printf("gpControlThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (gpcontrol.pfSaveFile != NULL)
	{
		fclose(gpcontrol.pfSaveFile); 
		gpcontrol.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectgpControl(&gpcontrol);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}